

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O1

bool __thiscall
wasm::anon_unknown_147::SignaturePruning::iteration(SignaturePruning *this,Module *module)

{
  pointer *pppCVar1;
  pointer *pppCVar2;
  __node_base_ptr this_00;
  __node_base_ptr *this_01;
  pointer puVar3;
  pointer ppCVar4;
  iterator __position;
  long lVar5;
  pointer ppCVar6;
  iterator __position_00;
  iterator __position_01;
  long *plVar7;
  _Hash_node_base *p_Var8;
  char *pcVar9;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
  *p_Var10;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
  *this_02;
  _Hash_node_base **pp_Var11;
  pointer pHVar12;
  Module *module_00;
  Type TVar13;
  __node_base _Var14;
  Type TVar15;
  pointer puVar16;
  bool bVar17;
  HeapTypeKind HVar18;
  uint uVar19;
  mapped_type_conflict *pmVar20;
  Function *pFVar21;
  mapped_type *pmVar22;
  Call *pCVar23;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_03;
  size_t sVar24;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar25;
  size_type sVar26;
  Type *__args;
  mapped_type *pmVar27;
  _Hash_node_base *p_Var28;
  pointer puVar29;
  __hashtable *__h;
  pointer ppCVar30;
  pointer ppCVar31;
  _Storage<wasm::HeapType,_true> __n;
  _Link_type_conflict __x;
  _Hash_node_base *p_Var32;
  ulong uVar33;
  long *plVar34;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  undefined1 auVar35 [8];
  optional<wasm::HeapType> oVar36;
  undefined1 local_490 [8];
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  void *local_388;
  long local_378;
  undefined1 local_350 [16];
  code *local_340;
  undefined1 local_330 [8];
  SubTypes subTypes;
  bool bStack_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  Module *local_228;
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
  newSignatures;
  Type oldParams;
  undefined1 local_1a0 [8];
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  callTargetsToLocalize;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  undefined1 local_138 [8];
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  Signature sig;
  undefined1 auStack_e8 [8];
  SortedVector unusedParams;
  undefined1 local_c8 [8];
  SortedVector optimizedIndexes;
  _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Stack_a8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  _Storage<wasm::HeapType,_true> _Stack_88;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  callTargetTypes;
  _Storage<wasm::HeapType,_true> local_38;
  Module *module_local;
  
  local_158._M_unused._M_object = &local_38;
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp:90:16)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp:90:16)>
              ::_M_manager;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  puVar29 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = module;
  analysis._32_8_ = analysis._24_8_;
  local_38 = (_Storage<wasm::HeapType,_true>)module;
  if (puVar29 != puVar3) {
    do {
      local_490 = (undefined1  [8])
                  (puVar29->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
      ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                    *)&analysis,(key_type *)local_490);
      puVar29 = puVar29 + 1;
    } while (puVar29 != puVar3);
  }
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)local_1a0,
             (function<void_(wasm::Function_*,_Info_&)>_conflict *)&local_158);
  puVar29 = (local_228->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_228->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar29 != puVar3) {
    do {
      pFVar21 = (puVar29->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar21->super_Importable).module + 8) != (char *)0x0) {
        local_330 = (undefined1  [8])pFVar21;
        pmVar20 = std::
                  map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                  ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                *)&analysis,(key_type *)local_330);
        local_490 = (undefined1  [8])pFVar21;
        if (callTargetsToLocalize._M_h._M_bucket_count == 0) {
          std::__throw_bad_function_call();
        }
        (*(code *)callTargetsToLocalize._M_h._M_before_begin._M_nxt)(local_1a0,local_490,pmVar20);
      }
      puVar29 = puVar29 + 1;
    } while (puVar29 != puVar3);
  }
  module_00 = local_228;
  local_330 = (undefined1  [8])&PTR__PassRunner_01091270;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_228;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_228->allocator;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subTypes.typeSubTypes._M_h._M_buckets._0_1_ = 0;
  subTypes.typeSubTypes._M_h._M_buckets._1_7_ = 0;
  subTypes.typeSubTypes._M_h._M_bucket_count._0_1_ = 0;
  subTypes.typeSubTypes._M_h._9_8_ = 0;
  subTypes.typeSubTypes._M_h._M_before_begin._M_nxt._1_2_ = 0x101;
  subTypes.typeSubTypes._M_h._20_8_ = 0;
  subTypes.typeSubTypes._M_h._28_8_ = 0xffffffff00000002;
  subTypes.typeSubTypes._M_h._M_rehash_policy._4_4_ = 0x14;
  subTypes.typeSubTypes._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  subTypes.typeSubTypes._M_h._44_5_ = 0;
  subTypes.typeSubTypes._M_h._M_single_bucket._1_3_ = 0;
  subTypes.typeSubTypes._M_h._M_single_bucket._4_1_ = false;
  subTypes.typeSubTypes._M_h._M_single_bucket._5_1_ = false;
  subTypes.typeSubTypes._M_h._M_single_bucket._6_1_ = false;
  subTypes.typeSubTypes._M_h._M_single_bucket._7_1_ = false;
  bStack_2d8 = false;
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)local_138,
             (function<void_(wasm::Function_*,_Info_&)>_conflict *)local_1a0);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
  iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std
  ::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::
  Module*)::Info&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,std::less<wasm::
  Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
  SignaturePruning::iteration(wasm::Module*)::Info>>>&,std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info__>_
            (local_490,module_00,(Map *)&analysis,(Func *)local_138);
  if (sigFuncs.Map._M_h._M_buckets != (__buckets_ptr)local_330 &&
      sigFuncs.Map._M_h._M_buckets != (__buckets_ptr)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)local_330;
  (**(code **)&(((Importable *)local_490)->super_Named).hasExplicitName)(local_490,local_228);
  local_490 = (undefined1  [8])&PTR__Mapper_01094a58;
  if (local_340 != (code *)0x0) {
    (*local_340)(local_350,local_350,3);
  }
  if (local_388 != (void *)0x0) {
    operator_delete(local_388,local_378 - (long)local_388);
  }
  Pass::~Pass((Pass *)local_490);
  if (allInfo._M_h._M_bucket_count != 0) {
    (*(code *)allInfo._M_h._M_bucket_count)(local_138,local_138,3);
  }
  PassRunner::~PassRunner((PassRunner *)local_330);
  if (callTargetsToLocalize._M_h._M_bucket_count != 0) {
    (*(code *)callTargetsToLocalize._M_h._M_bucket_count)(local_1a0,local_1a0,3);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  local_138 = (undefined1  [8])&allInfo._M_h._M_rehash_policy._M_next_resize;
  allInfo._M_h._M_buckets = (__buckets_ptr)0x1;
  allInfo._M_h._M_bucket_count = 0;
  allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  allInfo._M_h._M_element_count._0_4_ = 0x3f800000;
  allInfo._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  allInfo._M_h._M_rehash_policy._4_4_ = 0;
  allInfo._M_h._M_rehash_policy._M_next_resize = 0;
  local_490 = (undefined1  [8])&sigFuncs.Map._M_h._M_rehash_policy._M_next_resize;
  sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)0x1;
  sigFuncs.Map._M_h._M_bucket_count = 0;
  sigFuncs.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  sigFuncs.Map._M_h._M_element_count._0_4_ = 0x3f800000;
  sigFuncs.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  sigFuncs.Map._M_h._M_rehash_policy._4_4_ = 0;
  sigFuncs.Map._M_h._M_rehash_policy._M_next_resize = 0;
  sigFuncs.Map._M_h._M_single_bucket = (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket;
  sigFuncs.List.
  super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_1a0 = (undefined1  [8])&callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize;
  callTargetsToLocalize._M_h._M_buckets = (__buckets_ptr)0x1;
  callTargetsToLocalize._M_h._M_bucket_count = 0;
  callTargetsToLocalize._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callTargetsToLocalize._M_h._M_element_count._0_4_ = 0x3f800000;
  callTargetsToLocalize._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  callTargetsToLocalize._M_h._M_rehash_policy._4_4_ = 0;
  callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize = 0;
  puVar29 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)((long)local_38 + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)((long)local_38 + 0x20);
  sigFuncs.List.
  super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)sigFuncs.Map._M_h._M_single_bucket;
  if (puVar29 !=
      (pointer)optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
    do {
      analysis._48_8_ =
           (puVar29->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar20 = std::
                map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                              *)&analysis,(key_type *)&analysis.field_0x30);
      ppCVar4 = (pmVar20->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar30 = (pmVar20->calls).
                      super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppCVar30 != ppCVar4; ppCVar30 = ppCVar30 + 1
          ) {
        local_330 = (undefined1  [8])*ppCVar30;
        pFVar21 = Module::getFunction((Module *)local_38,
                                      (IString)*(IString *)
                                                &(((key_type)local_330)->super_Importable).base.
                                                 super_IString.str._M_str);
        pmVar22 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)local_138,&pFVar21->type);
        __position._M_current =
             (pmVar22->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar22->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Call*,std::allocator<wasm::Call*>>::_M_realloc_insert<wasm::Call*const&>
                    ((vector<wasm::Call*,std::allocator<wasm::Call*>> *)pmVar22,__position,
                     (Call **)local_330);
        }
        else {
          *__position._M_current = (Call *)local_330;
          pppCVar1 = &(pmVar22->calls).
                      super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        _Stack_88 = local_38;
        pCVar23 = Intrinsics::isCallWithoutEffects
                            ((Intrinsics *)&_Stack_88._M_value,(Expression *)local_330);
        if (pCVar23 != (Call *)0x0) {
          sVar24 = (((Importable *)local_330)->module).super_IString.str._M_len;
          if (sVar24 == 0) {
            __assert_fail("usedElements > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xd0,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          lVar5 = *(long *)(*(long *)&(((Importable *)local_330)->super_Named).hasExplicitName +
                           (sVar24 - 1) * 8);
          if (*(long *)(lVar5 + 8) != 1) {
            _Stack_88._M_value = wasm::Type::getHeapType((Type *)(lVar5 + 8));
            pmVar22 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)local_138,&_Stack_88._M_value);
            pmVar22->optimizable = false;
          }
        }
      }
      ppCVar6 = (pmVar20->callRefs).
                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar31 = (pmVar20->callRefs).
                      super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppCVar31 != ppCVar6; ppCVar31 = ppCVar31 + 1
          ) {
        local_330 = (undefined1  [8])*ppCVar31;
        _Stack_88 = (_Storage<wasm::HeapType,_true>)
                    (((_Storage<wasm::HeapType,_true> *)
                     ((((key_type)local_330)->super_Importable).base.super_IString.str._M_str + 8))
                    ->_M_value).id;
        if (_Stack_88 != (_Storage<wasm::HeapType,_true>)0x1) {
          local_c8 = (undefined1  [8])wasm::Type::getHeapType((Type *)&_Stack_88._M_value);
          pmVar22 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)local_138,(key_type *)local_c8);
          __position_00._M_current =
               (pmVar22->callRefs).
               super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pmVar22->callRefs).
              super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>::
            _M_realloc_insert<wasm::CallRef*const&>
                      ((vector<wasm::CallRef*,std::allocator<wasm::CallRef*>> *)&pmVar22->callRefs,
                       __position_00,(CallRef **)local_330);
          }
          else {
            *__position_00._M_current = (CallRef *)local_330;
            pppCVar2 = &(pmVar22->callRefs).
                        super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppCVar2 = *pppCVar2 + 1;
          }
        }
      }
      pmVar22 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_138,(key_type *)(analysis._48_8_ + 0x38));
      p_Var32 = (pmVar20->usedParams)._M_h._M_before_begin._M_nxt;
      if (p_Var32 != (_Hash_node_base *)0x0) {
        do {
          _Stack_88._M_value.id._0_4_ = *(undefined4 *)&p_Var32[1]._M_nxt;
          local_330 = (undefined1  [8])&pmVar22->usedParams;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&pmVar22->usedParams,&_Stack_88,local_330);
          p_Var32 = p_Var32->_M_nxt;
        } while (p_Var32 != (_Hash_node_base *)0x0);
      }
      if (pmVar20->optimizable == false) {
        pmVar22 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)local_138,(key_type *)(analysis._48_8_ + 0x38));
        pmVar22->optimizable = false;
      }
      this_03 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                              *)local_490,(HeapType *)(analysis._48_8_ + 0x38));
      __position_01._M_current = *(Function ***)(this_03 + 8);
      if (__position_01._M_current == *(Function ***)(this_03 + 0x10)) {
        std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
        _M_realloc_insert<wasm::Function*const&>
                  (this_03,__position_01,(Function **)&analysis.field_0x30);
      }
      else {
        *__position_01._M_current = (Function *)analysis._48_8_;
        *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
      }
      puVar29 = puVar29 + 1;
    } while (puVar29 !=
             (pointer)optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_330,(Module *)local_38
            );
  pHVar12 = subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_330 !=
      (undefined1  [8])
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar35 = local_330;
    do {
      analysis._48_8_ =
           (((key_type)auVar35)->super_Importable).super_Named.name.super_IString.str._M_len;
      if (((ulong)analysis._48_8_ < 0x7d && ((uint)analysis._48_8_ & 0x7b) == 0x10) ||
         (HVar18 = HeapType::getKind((HeapType *)&analysis.field_0x30), HVar18 == Func)) {
        pmVar22 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)local_138,(key_type *)&analysis.field_0x30);
        pmVar22->optimizable = false;
      }
      auVar35 = (undefined1  [8])
                &(((key_type)auVar35)->super_Importable).super_Named.name.super_IString.str._M_str;
    } while (auVar35 != (undefined1  [8])pHVar12);
  }
  if (local_330 != (undefined1  [8])0x0) {
    operator_delete((void *)local_330,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_330);
  }
  plVar34 = *(long **)((long)local_38 + 0x48);
  plVar7 = *(long **)((long)local_38 + 0x50);
  if (plVar34 != plVar7) {
    do {
      pmVar22 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_138,(key_type *)(*plVar34 + 0x38));
      pmVar22->optimizable = false;
      plVar34 = plVar34 + 1;
    } while (plVar34 != plVar7);
  }
  SubTypes::SubTypes((SubTypes *)local_330,(Module *)local_38);
  analysis._48_8_ = &newSignatures._M_h._M_rehash_policy._M_next_resize;
  newSignatures._M_h._M_buckets = (__buckets_ptr)0x1;
  newSignatures._M_h._M_bucket_count = 0;
  newSignatures._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  newSignatures._M_h._M_element_count._0_4_ = 0x3f800000;
  newSignatures._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  newSignatures._M_h._M_rehash_policy._4_4_ = 0;
  newSignatures._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var32 = sigFuncs.Map._M_h._M_single_bucket;
  if (sigFuncs.Map._M_h._M_single_bucket != (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket) {
    do {
      this_00 = p_Var32 + 2;
      join_0x00000010_0x00000000_ = HeapType::getSignature((HeapType *)this_00);
      pmVar22 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_138,(key_type *)this_00);
      sVar24 = wasm::Type::size((Type *)&allInfo._M_h._M_single_bucket);
      if ((pmVar22->optimizable != false) &&
         (pvVar25 = SubTypes::getImmediateSubTypes((SubTypes *)local_330,(HeapType)this_00->_M_nxt),
         (pvVar25->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_start ==
         (pvVar25->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        oVar36 = HeapType::getDeclaredSuperType((HeapType *)this_00);
        _Stack_88 = oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_payload;
        callTargetTypes._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT71(callTargetTypes._M_h._M_buckets._1_7_,
                      oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if ((((undefined1  [16])
              oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
             (undefined1  [16])0x0) ||
           (HVar18 = HeapType::getKind(&_Stack_88._M_value), HVar18 != Func)) {
          optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&pmVar22->callRefs;
          ParamUtils::applyConstantValues
                    ((SortedVector *)local_c8,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)(p_Var32 + 3),
                     &pmVar22->calls,
                     (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                     optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Module *)local_38);
          puVar16 = optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (auVar35 = local_c8; auVar35 != (undefined1  [8])puVar16;
              auVar35 = (undefined1  [8])((long)auVar35 + 4)) {
            _Stack_88._M_value.id._0_4_ = *(undefined4 *)auVar35;
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(pmVar22->usedParams)._M_h,&_Stack_88);
          }
          if ((pmVar22->usedParams)._M_h._M_element_count != sVar24) {
            auStack_e8 = (undefined1  [8])0x0;
            unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            _Stack_88 = (_Storage<wasm::HeapType,_true>)
                        ((ulong)(uint)_Stack_88._M_value.id._4_4_ << 0x20);
            if (sVar24 != 0) {
              do {
                sVar26 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&(pmVar22->usedParams)._M_h,(key_type *)&_Stack_88);
                if (sVar26 == 0) {
                  SortedVector::insert((SortedVector *)auStack_e8,_Stack_88._M_value.id._0_4_);
                }
                uVar19 = _Stack_88._M_value.id._0_4_ + 1;
                _Stack_88._M_value.id._0_4_ = uVar19;
              } while (uVar19 < sVar24);
            }
            newSignatures._M_h._M_single_bucket = allInfo._M_h._M_single_bucket;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_240,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8)
            ;
            ParamUtils::removeParameters
                      ((pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> *)
                       &_Stack_88._M_value,
                       (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)(p_Var32 + 3),
                       (SortedVector *)&local_240,&pmVar22->calls,
                       (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                       optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(Module *)local_38,
                       (this->super_Pass).runner);
            this_01 = &callTargetsToLocalize._M_h._M_single_bucket;
            if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_240.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_240.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_240.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((int)callTargetTypes._M_h._M_before_begin._M_nxt == 1) {
              ppCVar30 = (pmVar22->calls).
                         super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (ppCVar30 ==
                  (pmVar22->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                ppCVar31 = (pmVar22->callRefs).
                           super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                if (ppCVar31 ==
                    (pmVar22->callRefs).
                    super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  __assert_fail("!info.callRefs.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                                ,0x100,
                                "bool wasm::(anonymous namespace)::SignaturePruning::iteration(Module *)"
                               );
                }
                callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)*ppCVar31;
                p_Stack_a8 = (_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_1a0;
                std::
                _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<wasm::Expression*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                          (p_Stack_a8,this_01,
                           (vector<wasm::Type,std::allocator<wasm::Type>> *)&p_Stack_a8);
              }
              else {
                callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)*ppCVar30;
                p_Stack_a8 = (_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_1a0;
                std::
                _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<wasm::Expression*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                          (p_Stack_a8,this_01,
                           (vector<wasm::Type,std::allocator<wasm::Type>> *)&p_Stack_a8);
              }
            }
            if (_Stack_88 != (_Storage<wasm::HeapType,_true>)callTargetTypes._M_h._M_buckets) {
              p_Stack_a8 = (_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)0x0;
              newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              if (sVar24 != 0) {
                uVar33 = 0;
                do {
                  bVar17 = SortedVector::has((SortedVector *)&_Stack_88._M_value,(Index)uVar33);
                  if (!bVar17) {
                    callTargetsToLocalize._M_h._M_single_bucket =
                         (__node_base_ptr)&newSignatures._M_h._M_single_bucket;
                    __args = wasm::Type::Iterator::operator*((Iterator *)this_01);
                    if (newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      std::vector<wasm::Type,std::allocator<wasm::Type>>::
                      _M_realloc_insert<wasm::Type_const&>
                                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&p_Stack_a8,
                                 (iterator)
                                 newParams.
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start,__args);
                    }
                    else {
                      (newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                       .super__Vector_impl_data._M_start)->id = __args->id;
                      newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1;
                    }
                  }
                  uVar33 = (ulong)((Index)uVar33 + 1);
                } while (uVar33 < sVar24);
              }
              wasm::Type::Type(&oldParams,(Tuple *)&p_Stack_a8);
              TVar13 = oldParams;
              TVar15.id = sig.params.id;
              pmVar27 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&analysis.field_0x30,(key_type *)this_00);
              (pmVar27->params).id = TVar13.id;
              (pmVar27->results).id = TVar15.id;
              p_Var8 = p_Var32[4]._M_nxt;
              for (p_Var28 = p_Var32[3]._M_nxt; p_Var28 != p_Var8; p_Var28 = p_Var28 + 1) {
                p_Var28->_M_nxt[7]._M_nxt = this_00->_M_nxt;
              }
              if (p_Stack_a8 !=
                  (_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)0x0) {
                operator_delete(p_Stack_a8,
                                (long)newParams.
                                      super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)p_Stack_a8);
              }
            }
            if (_Stack_88 != (_Storage<wasm::HeapType,_true>)0x0) {
              operator_delete((void *)_Stack_88,
                              callTargetTypes._M_h._M_bucket_count - (long)_Stack_88);
            }
            if (auStack_e8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_e8,
                              (long)unusedParams.
                                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)auStack_e8);
            }
          }
          if (local_c8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_c8,
                            (long)optimizedIndexes.
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)local_c8);
          }
        }
      }
      pp_Var11 = &p_Var32->_M_nxt;
      p_Var32 = *pp_Var11;
    } while (*pp_Var11 != (_Hash_node_base *)&sigFuncs.Map._M_h._M_single_bucket);
  }
  _Stack_88 = (_Storage<wasm::HeapType,_true>)0x0;
  callTargetTypes._M_h._M_buckets = (__buckets_ptr)0x0;
  callTargetTypes._M_h._M_bucket_count = 0;
  __n = local_38;
  GlobalTypeRewriter::updateSignatures
            ((SignatureUpdates *)&analysis.field_0x30,(Module *)local_38,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&_Stack_88._M_value);
  if (_Stack_88 != (_Storage<wasm::HeapType,_true>)0x0) {
    __n = (_Storage<wasm::HeapType,_true>)(callTargetTypes._M_h._M_bucket_count - (long)_Stack_88);
    operator_delete((void *)_Stack_88,(ulong)__n);
  }
  _Var14._M_nxt = callTargetsToLocalize._M_h._M_before_begin._M_nxt;
  if (callTargetsToLocalize._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Stack_88 = (_Storage<wasm::HeapType,_true>)
                &callTargetTypes._M_h._M_rehash_policy._M_next_resize;
    callTargetTypes._M_h._M_buckets = (__buckets_ptr)0x1;
    callTargetTypes._M_h._M_bucket_count = 0;
    callTargetTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    callTargetTypes._M_h._M_element_count._0_4_ = 0x3f800000;
    callTargetTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    callTargetTypes._M_h._M_rehash_policy._4_4_ = 0;
    callTargetTypes._M_h._M_rehash_policy._M_next_resize = 0;
    if (callTargetsToLocalize._M_h._M_bucket_count != 0) {
      plVar34 = (long *)callTargetsToLocalize._M_h._M_bucket_count;
      do {
        pcVar9 = (char *)plVar34[1];
        auStack_e8 = (undefined1  [8])0x10;
        if (*pcVar9 == '=') {
          auStack_e8 = (undefined1  [8])
                       wasm::Type::getHeapType((Type *)(*(long *)(pcVar9 + 0x30) + 8));
        }
        else {
          if (*pcVar9 != '\x06') {
            handle_unreachable("bad call",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                               ,0x13e);
          }
          pFVar21 = Module::getFunction((Module *)local_38,(Name)((IString *)(pcVar9 + 0x30))->str);
          auStack_e8 = (undefined1  [8])(pFVar21->type).id;
        }
        local_c8 = (undefined1  [8])&_Stack_88;
        std::
        _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                  ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&_Stack_88,auStack_e8,local_c8);
        plVar34 = (long *)*plVar34;
      } while (plVar34 != (long *)0x0);
    }
    __n = local_38;
    ParamUtils::localizeCallsTo
              ((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                *)&_Stack_88._M_value,(Module *)local_38,(this->super_Pass).runner);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&_Stack_88._M_value);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&analysis.field_0x30);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&subTypes.types.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (local_330 != (undefined1  [8])0x0) {
    __n = (_Storage<wasm::HeapType,_true>)
          ((long)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)local_330);
    operator_delete((void *)local_330,(ulong)__n);
  }
  std::
  _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1a0);
  std::__cxx11::
  _List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::_M_clear((_List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
              *)&sigFuncs.Map._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_490);
  this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
             *)allInfo._M_h._M_bucket_count;
  while (this_02 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
          *)0x0) {
    p_Var10 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
                **)this_02;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
    ::_M_deallocate_node(this_02,(__node_ptr)__n);
    this_02 = p_Var10;
  }
  __x = (_Link_type_conflict)0x0;
  memset((void *)local_138,0,(long)allInfo._M_h._M_buckets << 3);
  allInfo._M_h._M_bucket_count = 0;
  allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((undefined1  [8])&allInfo._M_h._M_rehash_policy._M_next_resize != local_138) {
    __x = (_Link_type_conflict)((long)allInfo._M_h._M_buckets << 3);
    operator_delete((void *)local_138,(ulong)__x);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              *)analysis._16_8_,__x);
  return _Var14._M_nxt != (_Hash_node_base *)0x0;
}

Assistant:

bool iteration(Module* module) {
    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func, module);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Heap types of call targets that we found we should localize calls to, in
    // order to fully handle them. (See similar code in DeadArgumentElimination
    // for individual functions; here we handle a HeapType at a time.) A slight
    // complication is that we cannot track heap types here: heap types are
    // rewritten using |GlobalTypeRewriter::updateSignatures| below, and even
    // types that we do not modify end up replaced (as the entire set of types
    // becomes one new big rec group). We therefore need something more stable
    // to track here, which we do using either a Call or a Call Ref.
    std::unordered_set<Expression*> callTargetsToLocalize;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Find the public types, which cannot be modified.
    for (auto type : ModuleUtils::getPublicHeapTypes(*module)) {
      if (type.isFunction()) {
        allInfo[type].optimizable = false;
      }
    }

    // Similarly, we cannot yet modify types used in exception handling or stack
    // switching tags. TODO.
    for (auto& tag : module->tags) {
      allInfo[tag->type].optimizable = false;
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Maps each heap type to the possible pruned signature. We will fill this
    // during analysis and then use it while doing an update of the types. If a
    // type has no improvement that we can find, it will not appear in this map.
    std::unordered_map<HeapType, Signature> newSignatures;

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getImmediateSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getDeclaredSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto [removedIndexes, outcome] =
        ParamUtils::removeParameters(funcs,
                                     unusedParams,
                                     info.calls,
                                     info.callRefs,
                                     module,
                                     getPassRunner());
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        // Use either a Call or a CallRef that has this type (see explanation
        // above on |callTargetsToLocalize|.
        if (!info.calls.empty()) {
          callTargetsToLocalize.insert(info.calls[0]);
        } else {
          assert(!info.callRefs.empty());
          callTargetsToLocalize.insert(info.callRefs[0]);
        }
      }
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);

    if (callTargetsToLocalize.empty()) {
      return false;
    }

    // Localize after updating signatures, to not interfere with that
    // operation (localization adds locals, and the indexes of locals must be
    // taken into account in |GlobalTypeRewriter::updateSignatures| (as var
    // indexes change when params are pruned).
    std::unordered_set<HeapType> callTargetTypes;
    for (auto* call : callTargetsToLocalize) {
      HeapType type;
      if (auto* c = call->dynCast<Call>()) {
        type = module->getFunction(c->target)->type;
      } else if (auto* c = call->dynCast<CallRef>()) {
        type = c->target->type.getHeapType();
      } else {
        WASM_UNREACHABLE("bad call");
      }
      callTargetTypes.insert(type);
    }

    ParamUtils::localizeCallsTo(callTargetTypes, *module, getPassRunner());

    return true;
  }